

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

RedactionState
google::protobuf::TextFormat::IsOptionSensitive
          (Message *opts,Reflection *reflection,FieldDescriptor *option)

{
  bool bVar1;
  RedactionState RVar2;
  Type TVar4;
  CppType CVar5;
  EnumDescriptor *this;
  EnumValueDescriptor *this_00;
  EnumValueOptions *this_01;
  reference ppFVar6;
  Message *local_b8;
  int local_b0;
  int local_ac;
  int local_a8;
  FieldDescriptor *message_field;
  iterator __end5;
  iterator __begin5;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range5;
  undefined1 local_70 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  message_fields;
  Reflection *sub_reflection;
  Message *sub_message;
  int i_1;
  int count_1;
  EnumValueDescriptor *option_value;
  int local_30;
  int enum_val;
  int i;
  int count;
  FieldDescriptor *option_local;
  Reflection *reflection_local;
  Message *opts_local;
  RedactionState result;
  RedactionState RVar3;
  
  TVar4 = FieldDescriptor::type(option);
  if (TVar4 == TYPE_ENUM) {
    bVar1 = FieldDescriptor::is_repeated(option);
    if (bVar1) {
      local_a8 = Reflection::FieldSize(reflection,opts,option);
    }
    else {
      local_a8 = 1;
    }
    for (local_30 = 0; local_30 < local_a8; local_30 = local_30 + 1) {
      bVar1 = FieldDescriptor::is_repeated(option);
      if (bVar1) {
        local_ac = Reflection::GetRepeatedEnumValue(reflection,opts,option,local_30);
      }
      else {
        local_ac = Reflection::GetEnumValue(reflection,opts,option);
      }
      this = FieldDescriptor::enum_type(option);
      this_00 = EnumDescriptor::FindValueByNumber(this,local_ac);
      this_01 = EnumValueDescriptor::options(this_00);
      bVar1 = EnumValueOptions::debug_redact(this_01);
      if (bVar1) {
        RVar3.redact = true;
        RVar3.report = false;
        return RVar3;
      }
    }
  }
  else {
    CVar5 = FieldDescriptor::cpp_type(option);
    if (CVar5 == CPPTYPE_MESSAGE) {
      bVar1 = FieldDescriptor::is_repeated(option);
      if (bVar1) {
        local_b0 = Reflection::FieldSize(reflection,opts,option);
      }
      else {
        local_b0 = 1;
      }
      for (sub_message._0_4_ = 0; (int)sub_message < local_b0;
          sub_message._0_4_ = (int)sub_message + 1) {
        bVar1 = FieldDescriptor::is_repeated(option);
        if (bVar1) {
          local_b8 = Reflection::GetRepeatedMessage(reflection,opts,option,(int)sub_message);
        }
        else {
          local_b8 = Reflection::GetMessage(reflection,opts,option,(MessageFactory *)0x0);
        }
        message_fields.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)Message::GetReflection(local_b8);
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)local_70);
        Reflection::ListFields
                  ((Reflection *)
                   message_fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,local_b8,
                   (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)local_70);
        __end5 = std::
                 vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          *)local_70);
        message_field =
             (FieldDescriptor *)
             std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)local_70);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end5,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                           *)&message_field), bVar1) {
          ppFVar6 = __gnu_cxx::
                    __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                    ::operator*(&__end5);
          opts_local._6_2_ =
               IsOptionSensitive(local_b8,(Reflection *)
                                          message_fields.
                                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 *ppFVar6);
          if (((ushort)opts_local._6_2_ & 1) != 0) {
            bVar1 = true;
            goto LAB_00435544;
          }
          __gnu_cxx::
          __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
          ::operator++(&__end5);
        }
        bVar1 = false;
LAB_00435544:
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)local_70);
        if (bVar1) {
          return opts_local._6_2_;
        }
      }
    }
  }
  RVar2.redact = false;
  RVar2.report = false;
  return RVar2;
}

Assistant:

TextFormat::RedactionState TextFormat::IsOptionSensitive(
    const Message& opts, const Reflection* reflection,
    const FieldDescriptor* option) {
  if (option->type() == FieldDescriptor::TYPE_ENUM) {
    auto count =
        option->is_repeated() ? reflection->FieldSize(opts, option) : 1;
    for (auto i = 0; i < count; i++) {
      int enum_val = option->is_repeated()
                         ? reflection->GetRepeatedEnumValue(opts, option, i)
                         : reflection->GetEnumValue(opts, option);
      const EnumValueDescriptor* option_value =
          option->enum_type()->FindValueByNumber(enum_val);
      if (option_value->options().debug_redact()) {
        return TextFormat::RedactionState{true, false};
      }
    }
  } else if (option->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    auto count =
        option->is_repeated() ? reflection->FieldSize(opts, option) : 1;
    for (auto i = 0; i < count; i++) {
      const Message& sub_message =
          option->is_repeated()
              ? reflection->GetRepeatedMessage(opts, option, i)
              : reflection->GetMessage(opts, option);
      const Reflection* sub_reflection = sub_message.GetReflection();
      std::vector<const FieldDescriptor*> message_fields;
      sub_reflection->ListFields(sub_message, &message_fields);
      for (const FieldDescriptor* message_field : message_fields) {
        auto result = TextFormat::IsOptionSensitive(sub_message, sub_reflection,
                                                    message_field);
        if (result.redact) {
          return result;
        }
      }
    }
  }
  return TextFormat::RedactionState{false, false};
}